

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_curves.c
# Opt level: O0

int mbedtls_ecp_group_load(mbedtls_ecp_group *grp,mbedtls_ecp_group_id id)

{
  mbedtls_ecp_group_id id_local;
  mbedtls_ecp_group *grp_local;
  
  mbedtls_ecp_group_free(grp);
  grp->id = id;
  switch(id) {
  case MBEDTLS_ECP_DP_SECP192R1:
    grp->modp = ecp_mod_p192;
    grp_local._4_4_ =
         ecp_group_load(grp,secp192r1_p,0x18,(mbedtls_mpi_uint *)0x0,0,secp192r1_b,0x18,secp192r1_gx
                        ,0x18,secp192r1_gy,0x18,secp192r1_n,0x18);
    break;
  case MBEDTLS_ECP_DP_SECP224R1:
    grp->modp = ecp_mod_p224;
    grp_local._4_4_ =
         ecp_group_load(grp,secp224r1_p,0x20,(mbedtls_mpi_uint *)0x0,0,secp224r1_b,0x20,secp224r1_gx
                        ,0x20,secp224r1_gy,0x20,secp224r1_n,0x20);
    break;
  case MBEDTLS_ECP_DP_SECP256R1:
    grp->modp = ecp_mod_p256;
    grp_local._4_4_ =
         ecp_group_load(grp,secp256r1_p,0x20,(mbedtls_mpi_uint *)0x0,0,secp256r1_b,0x20,secp256r1_gx
                        ,0x20,secp256r1_gy,0x20,secp256r1_n,0x20);
    break;
  case MBEDTLS_ECP_DP_SECP384R1:
    grp->modp = ecp_mod_p384;
    grp_local._4_4_ =
         ecp_group_load(grp,secp384r1_p,0x30,(mbedtls_mpi_uint *)0x0,0,secp384r1_b,0x30,secp384r1_gx
                        ,0x30,secp384r1_gy,0x30,secp384r1_n,0x30);
    break;
  case MBEDTLS_ECP_DP_SECP521R1:
    grp->modp = ecp_mod_p521;
    grp_local._4_4_ =
         ecp_group_load(grp,secp521r1_p,0x48,(mbedtls_mpi_uint *)0x0,0,secp521r1_b,0x48,secp521r1_gx
                        ,0x48,secp521r1_gy,0x48,secp521r1_n,0x48);
    break;
  case MBEDTLS_ECP_DP_BP256R1:
    grp_local._4_4_ =
         ecp_group_load(grp,brainpoolP256r1_p,0x20,brainpoolP256r1_a,0x20,brainpoolP256r1_b,0x20,
                        brainpoolP256r1_gx,0x20,brainpoolP256r1_gy,0x20,brainpoolP256r1_n,0x20);
    break;
  case MBEDTLS_ECP_DP_BP384R1:
    grp_local._4_4_ =
         ecp_group_load(grp,brainpoolP384r1_p,0x30,brainpoolP384r1_a,0x30,brainpoolP384r1_b,0x30,
                        brainpoolP384r1_gx,0x30,brainpoolP384r1_gy,0x30,brainpoolP384r1_n,0x30);
    break;
  case MBEDTLS_ECP_DP_BP512R1:
    grp_local._4_4_ =
         ecp_group_load(grp,brainpoolP512r1_p,0x40,brainpoolP512r1_a,0x40,brainpoolP512r1_b,0x40,
                        brainpoolP512r1_gx,0x40,brainpoolP512r1_gy,0x40,brainpoolP512r1_n,0x40);
    break;
  case MBEDTLS_ECP_DP_CURVE25519:
    grp->modp = ecp_mod_p255;
    grp_local._4_4_ = ecp_use_curve25519(grp);
    break;
  case MBEDTLS_ECP_DP_SECP192K1:
    grp->modp = ecp_mod_p192k1;
    grp_local._4_4_ =
         ecp_group_load(grp,secp192k1_p,0x18,secp192k1_a,8,secp192k1_b,8,secp192k1_gx,0x18,
                        secp192k1_gy,0x18,secp192k1_n,0x18);
    break;
  case MBEDTLS_ECP_DP_SECP224K1:
    grp->modp = ecp_mod_p224k1;
    grp_local._4_4_ =
         ecp_group_load(grp,secp224k1_p,0x20,secp224k1_a,8,secp224k1_b,8,secp224k1_gx,0x20,
                        secp224k1_gy,0x20,secp224k1_n,0x20);
    break;
  case MBEDTLS_ECP_DP_SECP256K1:
    grp->modp = ecp_mod_p256k1;
    grp_local._4_4_ =
         ecp_group_load(grp,secp256k1_p,0x20,secp256k1_a,8,secp256k1_b,8,secp256k1_gx,0x20,
                        secp256k1_gy,0x20,secp256k1_n,0x20);
    break;
  case MBEDTLS_ECP_DP_CURVE448:
    grp->modp = ecp_mod_p448;
    grp_local._4_4_ = ecp_use_curve448(grp);
    break;
  default:
    grp->id = MBEDTLS_ECP_DP_NONE;
    grp_local._4_4_ = -0x4e80;
  }
  return grp_local._4_4_;
}

Assistant:

int mbedtls_ecp_group_load( mbedtls_ecp_group *grp, mbedtls_ecp_group_id id )
{
    ECP_VALIDATE_RET( grp != NULL );
    mbedtls_ecp_group_free( grp );

    grp->id = id;

    switch( id )
    {
#if defined(MBEDTLS_ECP_DP_SECP192R1_ENABLED)
        case MBEDTLS_ECP_DP_SECP192R1:
            NIST_MODP( p192 );
            return( LOAD_GROUP( secp192r1 ) );
#endif /* MBEDTLS_ECP_DP_SECP192R1_ENABLED */

#if defined(MBEDTLS_ECP_DP_SECP224R1_ENABLED)
        case MBEDTLS_ECP_DP_SECP224R1:
            NIST_MODP( p224 );
            return( LOAD_GROUP( secp224r1 ) );
#endif /* MBEDTLS_ECP_DP_SECP224R1_ENABLED */

#if defined(MBEDTLS_ECP_DP_SECP256R1_ENABLED)
        case MBEDTLS_ECP_DP_SECP256R1:
            NIST_MODP( p256 );
            return( LOAD_GROUP( secp256r1 ) );
#endif /* MBEDTLS_ECP_DP_SECP256R1_ENABLED */

#if defined(MBEDTLS_ECP_DP_SECP384R1_ENABLED)
        case MBEDTLS_ECP_DP_SECP384R1:
            NIST_MODP( p384 );
            return( LOAD_GROUP( secp384r1 ) );
#endif /* MBEDTLS_ECP_DP_SECP384R1_ENABLED */

#if defined(MBEDTLS_ECP_DP_SECP521R1_ENABLED)
        case MBEDTLS_ECP_DP_SECP521R1:
            NIST_MODP( p521 );
            return( LOAD_GROUP( secp521r1 ) );
#endif /* MBEDTLS_ECP_DP_SECP521R1_ENABLED */

#if defined(MBEDTLS_ECP_DP_SECP192K1_ENABLED)
        case MBEDTLS_ECP_DP_SECP192K1:
            grp->modp = ecp_mod_p192k1;
            return( LOAD_GROUP_A( secp192k1 ) );
#endif /* MBEDTLS_ECP_DP_SECP192K1_ENABLED */

#if defined(MBEDTLS_ECP_DP_SECP224K1_ENABLED)
        case MBEDTLS_ECP_DP_SECP224K1:
            grp->modp = ecp_mod_p224k1;
            return( LOAD_GROUP_A( secp224k1 ) );
#endif /* MBEDTLS_ECP_DP_SECP224K1_ENABLED */

#if defined(MBEDTLS_ECP_DP_SECP256K1_ENABLED)
        case MBEDTLS_ECP_DP_SECP256K1:
            grp->modp = ecp_mod_p256k1;
            return( LOAD_GROUP_A( secp256k1 ) );
#endif /* MBEDTLS_ECP_DP_SECP256K1_ENABLED */

#if defined(MBEDTLS_ECP_DP_BP256R1_ENABLED)
        case MBEDTLS_ECP_DP_BP256R1:
            return( LOAD_GROUP_A( brainpoolP256r1 ) );
#endif /* MBEDTLS_ECP_DP_BP256R1_ENABLED */

#if defined(MBEDTLS_ECP_DP_BP384R1_ENABLED)
        case MBEDTLS_ECP_DP_BP384R1:
            return( LOAD_GROUP_A( brainpoolP384r1 ) );
#endif /* MBEDTLS_ECP_DP_BP384R1_ENABLED */

#if defined(MBEDTLS_ECP_DP_BP512R1_ENABLED)
        case MBEDTLS_ECP_DP_BP512R1:
            return( LOAD_GROUP_A( brainpoolP512r1 ) );
#endif /* MBEDTLS_ECP_DP_BP512R1_ENABLED */

#if defined(MBEDTLS_ECP_DP_CURVE25519_ENABLED)
        case MBEDTLS_ECP_DP_CURVE25519:
            grp->modp = ecp_mod_p255;
            return( ecp_use_curve25519( grp ) );
#endif /* MBEDTLS_ECP_DP_CURVE25519_ENABLED */

#if defined(MBEDTLS_ECP_DP_CURVE448_ENABLED)
        case MBEDTLS_ECP_DP_CURVE448:
            grp->modp = ecp_mod_p448;
            return( ecp_use_curve448( grp ) );
#endif /* MBEDTLS_ECP_DP_CURVE448_ENABLED */

        default:
            grp->id = MBEDTLS_ECP_DP_NONE;
            return( MBEDTLS_ERR_ECP_FEATURE_UNAVAILABLE );
    }
}